

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<float>::LoadWeightedResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  float fVar1;
  uint uVar2;
  pair<int,_int> *ppVar3;
  float *pfVar4;
  ulong uVar5;
  long row;
  ulong uVar6;
  float extraout_XMM0_Da;
  
  TPZFMatrix<float>::Resize(&this->fLocalWeightedResidual,(long)this->fNEquations,1);
  uVar2 = (uint)(this->fGlobalEqs).fNElements;
  uVar5 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    ppVar3 = (this->fGlobalEqs).fStore;
    row = (long)ppVar3[uVar5].first;
    fVar1 = (this->fWeights).super_TPZVec<float>.fStore[row];
    (*(r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
    )(r_global,(long)ppVar3[uVar5].second,0);
    pfVar4 = TPZFMatrix<float>::operator()(&this->fLocalWeightedResidual,row,0);
    *pfVar4 = extraout_XMM0_Da * fVar1;
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::LoadWeightedResidual(const TPZFMatrix<TVar> &r_global){
	int i;
	fLocalWeightedResidual.Resize(fNEquations,1);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		fLocalWeightedResidual(ind.first,0) = fWeights[ind.first]*r_global.GetVal(ind.second,0);
	}
}